

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-optimizer.cpp
# Opt level: O2

bool __thiscall node_result_compare::operator()(node_result_compare *this,node *lhs,node *rhs)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = rhs->remaining_constraints;
  if (lhs->remaining_constraints != 0) {
    return lhs->remaining_constraints < iVar3 && iVar3 != 0;
  }
  if (iVar3 != 0) {
    return true;
  }
  dVar1 = lhs->solution;
  dVar2 = rhs->solution;
  if ((lhs->problem).type == maximize) {
    bVar4 = dVar1 < dVar2;
  }
  else {
    bVar4 = dVar2 < dVar1;
  }
  return !bVar4 && dVar2 != dVar1;
}

Assistant:

bool operator()(const node& lhs, const node& rhs) const
    {
        if (lhs.remaining_constraints == 0) {
            if (rhs.remaining_constraints == 0) {
                return lhs.problem.type ==
                           baryonyx::objective_function_type::maximize
                         ? lhs.solution > rhs.solution
                         : lhs.solution < rhs.solution;
            }

            return true;
        } else {
            if (rhs.remaining_constraints == 0) {
                return false;
            } else {
                return lhs.remaining_constraints < rhs.remaining_constraints;
            }
        }
    }